

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMan.c
# Opt level: O0

float Nwl_ManComputeTotalSwitching(Nwk_Man_t *pNtk)

{
  int *piVar1;
  int iVar2;
  Aig_Man_t *pAig_00;
  Vec_Int_t *p;
  Nwk_Obj_t *p_00;
  Aig_Obj_t *pAVar3;
  int local_40;
  float local_3c;
  int i;
  float Result;
  Nwk_Obj_t *pObjAbc;
  Aig_Obj_t *pObjAig;
  Aig_Man_t *pAig;
  float *pSwitching;
  Vec_Int_t *vSwitching;
  Nwk_Man_t *pNtk_local;
  
  local_3c = 0.0;
  pAig_00 = Nwk_ManStrash(pNtk);
  p = Saig_ManComputeSwitchProbs(pAig_00,0x30,0x10,0);
  piVar1 = p->pArray;
  for (local_40 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_40 < iVar2; local_40 = local_40 + 1) {
    p_00 = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,local_40);
    if ((p_00 != (Nwk_Obj_t *)0x0) &&
       (pAVar3 = Aig_Regular((Aig_Obj_t *)p_00->pCopy), pAVar3 != (Aig_Obj_t *)0x0)) {
      iVar2 = Nwk_ObjFanoutNum(p_00);
      local_3c = (float)iVar2 * (float)piVar1[pAVar3->Id] + local_3c;
    }
  }
  Vec_IntFree(p);
  Aig_ManStop(pAig_00);
  return local_3c;
}

Assistant:

float Nwl_ManComputeTotalSwitching( Nwk_Man_t * pNtk )
{
    extern Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * p, int nFrames, int nPref, int fProbOne );
    Vec_Int_t * vSwitching;
    float * pSwitching;
    Aig_Man_t * pAig;
    Aig_Obj_t * pObjAig;
    Nwk_Obj_t * pObjAbc;
    float Result = (float)0;
    int i;
    // strash the network
    // map network into an AIG
    pAig = Nwk_ManStrash( pNtk );
    vSwitching = Saig_ManComputeSwitchProbs( pAig, 48, 16, 0 );
    pSwitching = (float *)vSwitching->pArray;
    Nwk_ManForEachObj( pNtk, pObjAbc, i )
    {
        if ( (pObjAig = Aig_Regular((Aig_Obj_t *)pObjAbc->pCopy)) )
            Result += Nwk_ObjFanoutNum(pObjAbc) * pSwitching[pObjAig->Id];
    }
    Vec_IntFree( vSwitching );
    Aig_ManStop( pAig );
    return Result;
}